

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredlines.cc
# Opt level: O1

void __thiscall gvr::ColoredLines::resizeLineList(ColoredLines *this,int ln)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0xffffffffffffffff;
  if (-1 < ln * 2) {
    uVar4 = (long)(ln * 2) * 4;
  }
  puVar2 = (uint *)operator_new__(uVar4);
  iVar3 = this->n;
  if (ln <= this->n) {
    iVar3 = ln;
  }
  if (0 < iVar3) {
    uVar4 = (ulong)(iVar3 * 2 - 2);
    puVar1 = this->line;
    lVar5 = 1;
    do {
      puVar2[uVar4 + lVar5] = puVar1[uVar4 + lVar5];
      lVar5 = lVar5 + -1;
    } while (1 < iVar3 * 2 + (int)lVar5);
  }
  if (this->line != (uint *)0x0) {
    operator_delete__(this->line);
  }
  this->line = puVar2;
  this->n = ln;
  return;
}

Assistant:

void ColoredLines::resizeLineList(int ln)
{
  unsigned int *p=new unsigned int [(ln<<1)];

  for (int i=2*std::min(n, ln)-1; i>=0; i--)
  {
    p[i]=line[i];
  }

  delete [] line;

  line=p;
  n=ln;
}